

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall trompeloeil::trace_agent::~trace_agent(trace_agent *this)

{
  tracer *ptVar1;
  char *pcVar2;
  unsigned_long uVar3;
  string local_30 [32];
  trace_agent *local_10;
  trace_agent *this_local;
  
  local_10 = this;
  if (this->t != (tracer *)0x0) {
    ptVar1 = this->t;
    pcVar2 = (this->loc).file;
    uVar3 = (this->loc).line;
    std::__cxx11::ostringstream::str();
    (*(code *)**(undefined8 **)ptVar1)(ptVar1,pcVar2,uVar3,local_30);
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->os);
  return;
}

Assistant:

~trace_agent()
    {
      if (t)
      {
        t->trace(loc.file, loc.line, os.str());
      }
    }